

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O3

int main(int argc,char **argv)

{
  string *psVar1;
  bool bVar2;
  int iVar3;
  __pid_t _Var4;
  uint uVar5;
  FILE *__stream;
  size_type __n;
  size_t sVar6;
  clock_t cVar7;
  clock_t cVar8;
  _Rb_tree_node_base *p_Var9;
  ostream *poVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  char *pcVar12;
  Logger *pLVar13;
  Logger *pLVar14;
  int *piVar15;
  long lVar16;
  undefined8 uVar17;
  string *psVar18;
  string *extraout_RAX;
  ulong uVar19;
  undefined8 *puVar20;
  SendMethod in_R9;
  SendMethod SVar21;
  ulong uVar22;
  pointer __old_p;
  size_type __dnew;
  string dest;
  size_type __dnew_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string early_stderr;
  string prefix_attacher_data;
  undefined1 local_308 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  CheckOpString local_288 [2];
  undefined1 local_278 [8];
  LogMessageData *local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268 [14];
  ios_base local_180 [264];
  double local_78;
  char *local_70;
  long local_68;
  char local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  fLB::FLAGS_colorlogtostderr = 0;
  fLB::FLAGS_timestamp_in_logfile_name = 1;
  setbuf(_stderr,(char *)0x0);
  local_278 = (undefined1  [8])local_268;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_278,fLS::FLAGS_test_tmpdir_buf_abi_cxx11_,
             DAT_00142aa0 + fLS::FLAGS_test_tmpdir_buf_abi_cxx11_);
  std::__cxx11::string::append((char *)local_278);
  google::CaptureTestOutput(2,(string *)local_278);
  if (local_278 != (undefined1  [8])local_268) {
    free((void *)local_278);
  }
  LogWithLevels(fLI::FLAGS_v,fLI::FLAGS_stderrthreshold,(bool)fLB::FLAGS_logtostderr,
                (bool)fLB::FLAGS_alsologtostderr);
  LogWithLevels(0,0,false,false);
  uVar17 = google::s_captured_streams._16_8_;
  local_2e8._M_allocated_capacity = google::s_captured_streams._16_8_;
  google::s_captured_streams._16_8_ = 0;
  if (uVar17 == 0) {
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_278,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/googletest.h"
               ,0x183);
    poVar10 = google::LogMessage::stream((LogMessage *)local_278);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"Check failed: cap ",0x12);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,": did you forget CaptureTestStdout() or CaptureTestStderr()?",0x3c);
    goto LAB_0010cc73;
  }
  google::CapturedStream::StopCapture((CapturedStream *)uVar17);
  __stream = fopen(*(char **)(local_2e8._M_allocated_capacity + 8),"r");
  fseek(__stream,0,2);
  __n = ftell(__stream);
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_278,__n,(allocator_type *)local_308);
  uVar22 = 0;
  fseek(__stream,0,0);
  do {
    sVar6 = fread((char *)((long)local_278 + uVar22),1,__n - uVar22,__stream);
    uVar22 = uVar22 + sVar6;
    if (sVar6 == 0) break;
  } while (uVar22 < __n);
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,local_278,(char *)((long)local_278 + uVar22));
  if (local_278 != (undefined1  [8])0x0) {
    free((void *)local_278);
  }
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_allocated_capacity !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::default_delete<google::CapturedStream>::operator()
              ((default_delete<google::CapturedStream> *)local_2e8._M_local_buf,
               (CapturedStream *)local_2e8._M_allocated_capacity);
  }
  bVar2 = google::IsGoogleLoggingInitialized();
  if (bVar2) {
    main_cold_13();
LAB_0010c8c3:
    main_cold_1();
LAB_0010c8c8:
    main_cold_2();
LAB_0010c8cd:
    main_cold_3();
LAB_0010c8d2:
    main_cold_12();
LAB_0010c8d7:
    main_cold_4();
LAB_0010c8dc:
    main_cold_5();
LAB_0010c8e1:
    main_cold_9();
LAB_0010c8e6:
    main_cold_11();
LAB_0010c8eb:
    main_cold_6();
LAB_0010c8f0:
    main_cold_7();
LAB_0010c8f5:
    main_cold_8();
LAB_0010c8fa:
    main_cold_10();
    psVar18 = extraout_RAX;
  }
  else {
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"good data","");
    google::InitGoogleLogging(*argv,PrefixAttacher,local_50);
    bVar2 = google::IsGoogleLoggingInitialized();
    uVar5 = fLI::FLAGS_benchmark_iters;
    if (!bVar2) goto LAB_0010c8c3;
    if (fLB::FLAGS_run_benchmark == '\x01') {
      puts("Benchmark\tTime(ns)\tIterations");
      if (google::g_benchlist_abi_cxx11_._24_8_ != 0x142b08) {
        local_78 = (double)(int)uVar5;
        p_Var9 = (_Rb_tree_node_base *)google::g_benchlist_abi_cxx11_._24_8_;
        do {
          cVar7 = clock();
          (**(code **)(p_Var9 + 2))(uVar5);
          cVar8 = clock();
          printf("%s\t%8.2lf\t%10d\n",
                 SUB84(((((double)cVar8 - (double)cVar7) / 1000000.0) * 1000.0 * 1000.0 * 1000.0) /
                       local_78,0),*(undefined8 *)(p_Var9 + 1),(ulong)uVar5);
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
        } while (p_Var9 != (_Rb_tree_node_base *)(google::g_benchlist_abi_cxx11_ + 8));
      }
      putchar(10);
    }
    fLB::FLAGS_logtostderr = 1;
    puVar20 = google::g_testlist;
    if (google::g_testlist != DAT_00142af0) {
      do {
        (*(code *)*puVar20)();
        puVar20 = puVar20 + 1;
      } while (puVar20 != DAT_00142af0);
    }
    fprintf(_stderr,"Passed %d tests\n\nPASS\n",
            (ulong)((long)puVar20 - (long)google::g_testlist) >> 3 & 0xffffffff);
    local_278 = (undefined1  [8])local_268;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_278,fLS::FLAGS_test_tmpdir_buf_abi_cxx11_,
               DAT_00142aa0 + fLS::FLAGS_test_tmpdir_buf_abi_cxx11_);
    std::__cxx11::string::append(local_278);
    google::CaptureTestOutput(2,(string *)local_278);
    if (local_278 != (undefined1  [8])local_268) {
      free((void *)local_278);
    }
    google::LogMessage::LogMessage((LogMessage *)local_278,"dummy",-1,GLOG_INFO);
    poVar10 = google::LogMessage::stream((LogMessage *)local_278);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_70,local_68);
    google::LogMessage::~LogMessage((LogMessage *)local_278);
    TestLogging(true);
    TestRawLogging();
    TestLoggingLevels();
    iVar3 = TestVlogHelper();
    if (iVar3 != 0) goto LAB_0010c8c8;
    iVar3 = google::SetVLOGLevel("logging_unittest",1);
    if (iVar3 != 0) goto LAB_0010c8cd;
    iVar3 = TestVlogHelper();
    if (iVar3 == 0) goto LAB_0010c8d2;
    TestLogString();
    TestLogSink();
    TestLogToString();
    TestLogSinkWaitTillSent();
    TestDCHECK();
    TestSTREQ();
    local_278 = (undefined1  [8])local_268;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_278,fLS::FLAGS_test_srcdir_buf_abi_cxx11_,
               DAT_00142ac8 + fLS::FLAGS_test_srcdir_buf_abi_cxx11_);
    std::__cxx11::string::append(local_278);
    bVar2 = google::MungeAndDiffTest
                      ((string *)local_278,(CapturedStream *)google::s_captured_streams._16_8_);
    if (local_278 != (undefined1  [8])local_268) {
      free((void *)local_278);
    }
    if (!bVar2) goto LAB_0010c8d7;
    fLB::FLAGS_logtostderr = 0;
    fLB::FLAGS_logtostdout = 1;
    fLI::FLAGS_stderrthreshold = 4;
    local_278 = (undefined1  [8])local_268;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_278,fLS::FLAGS_test_tmpdir_buf_abi_cxx11_,
               DAT_00142aa0 + fLS::FLAGS_test_tmpdir_buf_abi_cxx11_);
    std::__cxx11::string::append(local_278);
    google::CaptureTestOutput(1,(string *)local_278);
    if (local_278 != (undefined1  [8])local_268) {
      free((void *)local_278);
    }
    TestRawLogging();
    TestLoggingLevels();
    TestLogString();
    TestLogSink();
    TestLogToString();
    TestLogSinkWaitTillSent();
    TestDCHECK();
    TestSTREQ();
    local_278 = (undefined1  [8])local_268;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_278,fLS::FLAGS_test_srcdir_buf_abi_cxx11_,
               DAT_00142ac8 + fLS::FLAGS_test_srcdir_buf_abi_cxx11_);
    std::__cxx11::string::append(local_278);
    bVar2 = google::MungeAndDiffTest
                      ((string *)local_278,(CapturedStream *)google::s_captured_streams._8_8_);
    if (local_278 != (undefined1  [8])local_268) {
      free((void *)local_278);
    }
    if (!bVar2) goto LAB_0010c8dc;
    fLB::FLAGS_logtostdout = 0;
    fwrite("==== Test setting log file basename\n",0x24,1,_stderr);
    local_2e8._M_allocated_capacity = (size_type)&local_2d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2e8,fLS::FLAGS_test_tmpdir_buf_abi_cxx11_,
               DAT_00142aa0 + fLS::FLAGS_test_tmpdir_buf_abi_cxx11_);
    std::__cxx11::string::append(local_2e8._M_local_buf);
    local_278 = (undefined1  [8])local_268;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_278,local_2e8._M_allocated_capacity,
               (char *)(local_2e8._8_8_ + local_2e8._M_allocated_capacity));
    std::__cxx11::string::append(local_278);
    DeleteFiles((string *)local_278);
    if (local_278 != (undefined1  [8])local_268) {
      free((void *)local_278);
    }
    google::SetLogDestination(GLOG_INFO,(char *)local_2e8._M_allocated_capacity);
    google::LogMessage::LogMessage
              ((LogMessage *)local_278,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
               ,0x329);
    poVar10 = google::LogMessage::stream((LogMessage *)local_278);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"message to new base",0x13);
    google::LogMessage::~LogMessage((LogMessage *)local_278);
    google::FlushLogFiles(GLOG_INFO);
    local_308._0_8_ = (LogMessageData *)0x13;
    local_278 = (undefined1  [8])local_268;
    local_278 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_278,(ulong)local_308);
    local_268[0]._M_allocated_capacity = local_308._0_8_;
    *(undefined8 *)local_278 = 0x206567617373656d;
    *(char *)((long)local_278 + 8) = 't';
    *(char *)((long)local_278 + 9) = 'o';
    *(char *)((long)local_278 + 10) = ' ';
    *(char *)((long)local_278 + 0xb) = 'n';
    *(char *)((long)local_278 + 0xc) = 'e';
    *(char *)((long)local_278 + 0xd) = 'w';
    *(char *)((long)local_278 + 0xe) = ' ';
    *(char *)((long)local_278 + 0xf) = 'b';
    *(char *)((long)local_278 + 0xf) = 'b';
    *(char *)((long)local_278 + 0x10) = 'a';
    *(char *)((long)local_278 + 0x11) = 's';
    *(char *)((long)local_278 + 0x12) = 'e';
    local_270 = (LogMessageData *)local_308._0_8_;
    *(char *)((long)local_278 + local_308._0_8_) = '\0';
    CheckFile((string *)local_2e8._M_allocated_capacity,(string *)local_2e8._8_8_,SUB81(local_278,0)
             );
    if (local_278 != (undefined1  [8])local_268) {
      free((void *)local_278);
    }
    google::LogToStderr();
    local_278 = (undefined1  [8])local_268;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_278,local_2e8._M_allocated_capacity,
               (char *)(local_2e8._8_8_ + local_2e8._M_allocated_capacity));
    std::__cxx11::string::append(local_278);
    DeleteFiles((string *)local_278);
    if (local_278 != (undefined1  [8])local_268) {
      free((void *)local_278);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_allocated_capacity != &local_2d8) {
      free((void *)local_2e8._M_allocated_capacity);
    }
    fwrite("==== Test setting log file basename without timestamp and appending properly\n",0x4d,1,
           _stderr);
    local_308._0_8_ = (string *)(local_308 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_308,fLS::FLAGS_test_tmpdir_buf_abi_cxx11_,
               DAT_00142aa0 + fLS::FLAGS_test_tmpdir_buf_abi_cxx11_);
    std::__cxx11::string::append(local_308);
    local_278 = (undefined1  [8])local_268;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_278,local_308._0_8_,
               (char *)((long)&((_Alloc_hider *)local_308._8_8_)->_M_p +
                       (long)&((_Alloc_hider *)local_308._0_8_)->_M_p));
    std::__cxx11::string::append(local_278);
    DeleteFiles((string *)local_278);
    if (local_278 != (undefined1  [8])local_268) {
      free((void *)local_278);
    }
    std::ofstream::ofstream(local_278,(char *)local_308._0_8_,_S_out);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"test preexisting content",0x18);
    std::ios::widen((char)(ostream *)local_278 + (char)*(undefined8 *)((long)local_278 + -0x18));
    std::ostream::put((char)local_278);
    std::ostream::flush();
    std::ofstream::close();
    local_288[0].str_ = (string *)0x18;
    local_2e8._M_allocated_capacity = (size_type)&local_2d8;
    local_2e8._M_allocated_capacity =
         std::__cxx11::string::_M_create(&local_2e8._M_allocated_capacity,(ulong)local_288);
    local_2d8._M_allocated_capacity = (size_type)local_288[0].str_;
    *(undefined8 *)local_2e8._M_allocated_capacity = 0x6572702074736574;
    *(undefined8 *)(local_2e8._M_allocated_capacity + 8) = 0x676e697473697865;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)(local_2e8._M_allocated_capacity + 0x10))->_M_allocated_capacity = 0x746e65746e6f6320;
    local_2e8._8_8_ = local_288[0].str_;
    *(char *)((long)&((local_288[0].str_)->_M_dataplus)._M_p + local_2e8._M_allocated_capacity) =
         '\0';
    CheckFile((string *)local_308._0_8_,(string *)local_308._8_8_,SUB81(&local_2e8,0));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_allocated_capacity != &local_2d8) {
      free((void *)local_2e8._M_allocated_capacity);
    }
    fLB::FLAGS_timestamp_in_logfile_name = 0;
    google::SetLogDestination(GLOG_INFO,(char *)local_308._0_8_);
    google::LogMessage::LogMessage
              ((LogMessage *)&local_2e8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
               ,0x343);
    poVar10 = google::LogMessage::stream((LogMessage *)&local_2e8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"message to new base, appending to preexisting file",0x32);
    google::LogMessage::~LogMessage((LogMessage *)&local_2e8);
    google::FlushLogFiles(GLOG_INFO);
    fLB::FLAGS_timestamp_in_logfile_name = 1;
    local_288[0].str_ = (string *)0x18;
    local_2e8._M_allocated_capacity = (size_type)&local_2d8;
    local_2e8._M_allocated_capacity =
         std::__cxx11::string::_M_create(&local_2e8._M_allocated_capacity,(ulong)local_288);
    local_2d8._M_allocated_capacity = (size_type)local_288[0].str_;
    *(undefined8 *)local_2e8._M_allocated_capacity = 0x6572702074736574;
    *(undefined8 *)(local_2e8._M_allocated_capacity + 8) = 0x676e697473697865;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)(local_2e8._M_allocated_capacity + 0x10))->_M_allocated_capacity = 0x746e65746e6f6320;
    local_2e8._8_8_ = local_288[0].str_;
    *(char *)((long)&((local_288[0].str_)->_M_dataplus)._M_p + local_2e8._M_allocated_capacity) =
         '\0';
    CheckFile((string *)local_308._0_8_,(string *)local_308._8_8_,SUB81(&local_2e8,0));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_allocated_capacity != &local_2d8) {
      free((void *)local_2e8._M_allocated_capacity);
    }
    local_288[0].str_ = (string *)0x32;
    local_2e8._M_allocated_capacity = (size_type)&local_2d8;
    local_2e8._M_allocated_capacity =
         std::__cxx11::string::_M_create(&local_2e8._M_allocated_capacity,(ulong)local_288);
    local_2d8._M_allocated_capacity = (size_type)local_288[0].str_;
    (((string *)(local_2e8._M_allocated_capacity + 0x20))->_M_dataplus)._M_p =
         (pointer)0x697865657270206f;
    *(undefined8 *)(local_2e8._M_allocated_capacity + 0x28) = 0x696620676e697473;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)(local_2e8._M_allocated_capacity + 0x10))->_M_allocated_capacity = 0x707061202c657361;
    *(char *)(local_2e8._M_allocated_capacity + 0x18) = 'e';
    *(char *)(local_2e8._M_allocated_capacity + 0x19) = 'n';
    *(char *)(local_2e8._M_allocated_capacity + 0x1a) = 'd';
    *(char *)(local_2e8._M_allocated_capacity + 0x1b) = 'i';
    *(char *)(local_2e8._M_allocated_capacity + 0x1c) = 'n';
    *(char *)(local_2e8._M_allocated_capacity + 0x1d) = 'g';
    *(char *)(local_2e8._M_allocated_capacity + 0x1e) = ' ';
    *(char *)(local_2e8._M_allocated_capacity + 0x1f) = 't';
    *(undefined8 *)local_2e8._M_allocated_capacity = 0x206567617373656d;
    *(undefined8 *)(local_2e8._M_allocated_capacity + 8) = 0x622077656e206f74;
    *(undefined2 *)(local_2e8._M_allocated_capacity + 0x30) = 0x656c;
    local_2e8._8_8_ = local_288[0].str_;
    *(char *)((long)&((local_288[0].str_)->_M_dataplus)._M_p + local_2e8._M_allocated_capacity) =
         '\0';
    CheckFile((string *)local_308._0_8_,(string *)local_308._8_8_,SUB81(&local_2e8,0));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_allocated_capacity != &local_2d8) {
      free((void *)local_2e8._M_allocated_capacity);
    }
    google::LogToStderr();
    local_2e8._M_allocated_capacity = (size_type)&local_2d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2e8,local_308._0_8_,
               (char *)((long)&((_Alloc_hider *)local_308._8_8_)->_M_p +
                       (long)&((_Alloc_hider *)local_308._0_8_)->_M_p));
    std::__cxx11::string::append(local_2e8._M_local_buf);
    DeleteFiles((string *)&local_2e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_allocated_capacity != &local_2d8) {
      free((void *)local_2e8._M_allocated_capacity);
    }
    local_278 = (undefined1  [8])_VTT;
    *(undefined8 *)(local_278 + *(long *)(_VTT + -0x18)) = ___throw_bad_array_new_length;
    std::filebuf::~filebuf((filebuf *)&local_270);
    std::ios_base::~ios_base(local_180);
    if ((string *)local_308._0_8_ != (string *)(local_308 + 0x10)) {
      free((void *)local_308._0_8_);
    }
    fwrite("==== Test setting log file basename and two processes writing - second should fail\n",
           0x53,1,_stderr);
    local_2e8._M_allocated_capacity = (size_type)&local_2d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2e8,fLS::FLAGS_test_tmpdir_buf_abi_cxx11_,
               DAT_00142aa0 + fLS::FLAGS_test_tmpdir_buf_abi_cxx11_);
    std::__cxx11::string::append(local_2e8._M_local_buf);
    local_278 = (undefined1  [8])local_268;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_278,local_2e8._M_allocated_capacity,
               (char *)(local_2e8._8_8_ + local_2e8._M_allocated_capacity));
    std::__cxx11::string::append(local_278);
    DeleteFiles((string *)local_278);
    if (local_278 != (undefined1  [8])local_268) {
      free((void *)local_278);
    }
    fLB::FLAGS_timestamp_in_logfile_name = 0;
    google::SetLogDestination(GLOG_INFO,(char *)local_2e8._M_allocated_capacity);
    google::LogMessage::LogMessage
              ((LogMessage *)local_278,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
               ,0x35e);
    poVar10 = google::LogMessage::stream((LogMessage *)local_278);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"message to new base, parent",0x1b);
    google::LogMessage::~LogMessage((LogMessage *)local_278);
    google::FlushLogFiles(GLOG_INFO);
    _Var4 = fork();
    if (_Var4 == 0) {
      google::LogMessage::LogMessage
                ((LogMessage *)local_278,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0x364);
      poVar10 = google::LogMessage::stream((LogMessage *)local_278);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,"message to new base, child - should only appear on STDERR not on the file"
                 ,0x49);
      google::LogMessage::~LogMessage((LogMessage *)local_278);
      google::ShutdownGoogleLogging();
      exit(0);
    }
    if (_Var4 == -1) {
      local_308._0_8_ = google::LogMessage::SendToLog;
      local_308._8_8_ = (string *)0x0;
      google::ErrnoLogMessage::ErrnoLogMessage
                ((ErrnoLogMessage *)local_278,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0x362,FATAL,0,in_R9);
      poVar10 = google::LogMessage::stream((LogMessage *)local_278);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"pid",3);
      google::ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)local_278);
    }
    else if (0 < _Var4) {
      wait((void *)0x0);
    }
    fLB::FLAGS_timestamp_in_logfile_name = 1;
    local_308._0_8_ = (LogMessageData *)0x1b;
    local_278 = (undefined1  [8])local_268;
    local_278 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_278,(ulong)local_308);
    local_268[0]._M_allocated_capacity = local_308._0_8_;
    *(char *)((long)local_278 + 0xb) = 'n';
    *(char *)((long)local_278 + 0xc) = 'e';
    *(char *)((long)local_278 + 0xd) = 'w';
    *(char *)((long)local_278 + 0xe) = ' ';
    *(char *)((long)local_278 + 0xf) = 'b';
    *(char *)((long)local_278 + 0x10) = 'a';
    *(char *)((long)local_278 + 0x11) = 's';
    *(char *)((long)local_278 + 0x12) = 'e';
    *(char *)((long)local_278 + 0x13) = ',';
    *(char *)((long)local_278 + 0x14) = ' ';
    *(char *)((long)local_278 + 0x15) = 'p';
    *(char *)((long)local_278 + 0x16) = 'a';
    *(char *)((long)local_278 + 0x17) = 'r';
    *(char *)((long)local_278 + 0x18) = 'e';
    *(char *)((long)local_278 + 0x19) = 'n';
    *(char *)((long)local_278 + 0x1a) = 't';
    *(undefined8 *)local_278 = 0x206567617373656d;
    *(char *)((long)local_278 + 8) = 't';
    *(char *)((long)local_278 + 9) = 'o';
    *(char *)((long)local_278 + 10) = ' ';
    *(char *)((long)local_278 + 0xb) = 'n';
    *(char *)((long)local_278 + 0xc) = 'e';
    *(char *)((long)local_278 + 0xd) = 'w';
    *(char *)((long)local_278 + 0xe) = ' ';
    *(char *)((long)local_278 + 0xf) = 'b';
    local_270 = (LogMessageData *)local_308._0_8_;
    *(char *)((long)local_278 + local_308._0_8_) = '\0';
    CheckFile((string *)local_2e8._M_allocated_capacity,(string *)local_2e8._8_8_,SUB81(local_278,0)
             );
    if (local_278 != (undefined1  [8])local_268) {
      free((void *)local_278);
    }
    local_308._0_8_ = (LogMessageData *)0x49;
    local_278 = (undefined1  [8])local_268;
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)std::__cxx11::string::_M_create((ulong *)local_278,(ulong)local_308);
    uVar17 = local_308._0_8_;
    local_268[0]._M_allocated_capacity = local_308._0_8_;
    local_278 = (undefined1  [8])paVar11;
    memcpy(paVar11,"message to new base, child - should only appear on STDERR not on the file",0x49)
    ;
    local_270 = (LogMessageData *)uVar17;
    paVar11->_M_local_buf[uVar17] = '\0';
    CheckFile((string *)local_2e8._M_allocated_capacity,(string *)local_2e8._8_8_,SUB81(local_278,0)
             );
    if (local_278 != (undefined1  [8])local_268) {
      free((void *)local_278);
    }
    google::LogToStderr();
    psVar1 = (string *)(local_308 + 0x10);
    local_278 = (undefined1  [8])local_268;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_278,local_2e8._M_allocated_capacity,
               (char *)(local_2e8._8_8_ + local_2e8._M_allocated_capacity));
    std::__cxx11::string::append(local_278);
    DeleteFiles((string *)local_278);
    if (local_278 != (undefined1  [8])local_268) {
      free((void *)local_278);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_allocated_capacity != &local_2d8) {
      free((void *)local_2e8._M_allocated_capacity);
    }
    fwrite("==== Test setting log file symlink\n",0x23,1,_stderr);
    local_2e8._M_allocated_capacity = (size_type)&local_2d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2e8,fLS::FLAGS_test_tmpdir_buf_abi_cxx11_,
               DAT_00142aa0 + fLS::FLAGS_test_tmpdir_buf_abi_cxx11_);
    std::__cxx11::string::append(local_2e8._M_local_buf);
    local_308._0_8_ = psVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_308,fLS::FLAGS_test_tmpdir_buf_abi_cxx11_,
               DAT_00142aa0 + fLS::FLAGS_test_tmpdir_buf_abi_cxx11_);
    std::__cxx11::string::append(local_308);
    local_278 = (undefined1  [8])local_268;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_278,local_2e8._M_allocated_capacity,
               (char *)(local_2e8._8_8_ + local_2e8._M_allocated_capacity));
    std::__cxx11::string::append(local_278);
    DeleteFiles((string *)local_278);
    if (local_278 != (undefined1  [8])local_268) {
      free((void *)local_278);
    }
    local_278 = (undefined1  [8])local_268;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_278,local_308._0_8_,
               (undefined1 *)
               ((long)&((_Alloc_hider *)local_308._8_8_)->_M_p +
               (long)&((_Alloc_hider *)local_308._0_8_)->_M_p));
    std::__cxx11::string::append(local_278);
    DeleteFiles((string *)local_278);
    if (local_278 != (undefined1  [8])local_268) {
      free((void *)local_278);
    }
    google::SetLogSymlink(GLOG_INFO,"symlinkbase");
    google::SetLogDestination(GLOG_INFO,(char *)local_2e8._M_allocated_capacity);
    google::LogMessage::LogMessage
              ((LogMessage *)local_278,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
               ,899);
    poVar10 = google::LogMessage::stream((LogMessage *)local_278);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"message to new symlink",0x16);
    google::LogMessage::~LogMessage((LogMessage *)local_278);
    google::FlushLogFiles(GLOG_INFO);
    local_288[0].str_ = (string *)0x16;
    local_278 = (undefined1  [8])local_268;
    local_278 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_278,(ulong)local_288);
    local_268[0]._M_allocated_capacity = local_288[0].str_;
    *(undefined8 *)local_278 = 0x206567617373656d;
    *(char *)((long)local_278 + 8) = 't';
    *(char *)((long)local_278 + 9) = 'o';
    *(char *)((long)local_278 + 10) = ' ';
    *(char *)((long)local_278 + 0xb) = 'n';
    *(char *)((long)local_278 + 0xc) = 'e';
    *(char *)((long)local_278 + 0xd) = 'w';
    *(char *)((long)local_278 + 0xe) = ' ';
    *(char *)((long)local_278 + 0xf) = 's';
    *(char *)((long)local_278 + 0xe) = ' ';
    *(char *)((long)local_278 + 0xf) = 's';
    *(char *)((long)local_278 + 0x10) = 'y';
    *(char *)((long)local_278 + 0x11) = 'm';
    *(char *)((long)local_278 + 0x12) = 'l';
    *(char *)((long)local_278 + 0x13) = 'i';
    *(char *)((long)local_278 + 0x14) = 'n';
    *(char *)((long)local_278 + 0x15) = 'k';
    local_270 = (LogMessageData *)local_288[0].str_;
    *(char *)((long)local_278 + (long)local_288[0].str_) = '\0';
    CheckFile((string *)local_308._0_8_,(string *)local_308._8_8_,SUB81(local_278,0));
    if (local_278 != (undefined1  [8])local_268) {
      free((void *)local_278);
    }
    local_278 = (undefined1  [8])local_268;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_278,local_2e8._M_allocated_capacity,
               (char *)(local_2e8._8_8_ + local_2e8._M_allocated_capacity));
    std::__cxx11::string::append(local_278);
    DeleteFiles((string *)local_278);
    if (local_278 != (undefined1  [8])local_268) {
      free((void *)local_278);
    }
    local_278 = (undefined1  [8])local_268;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_278,local_308._0_8_,
               (undefined1 *)
               ((long)&((_Alloc_hider *)local_308._8_8_)->_M_p +
               (long)&((_Alloc_hider *)local_308._0_8_)->_M_p));
    std::__cxx11::string::append(local_278);
    DeleteFiles((string *)local_278);
    if (local_278 != (undefined1  [8])local_268) {
      free((void *)local_278);
    }
    if ((string *)local_308._0_8_ != psVar1) {
      free((void *)local_308._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_allocated_capacity != &local_2d8) {
      free((void *)local_2e8._M_allocated_capacity);
    }
    fwrite("==== Test setting log file extension\n",0x25,1,_stderr);
    local_2e8._M_allocated_capacity = (size_type)&local_2d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2e8,fLS::FLAGS_test_tmpdir_buf_abi_cxx11_,
               DAT_00142aa0 + fLS::FLAGS_test_tmpdir_buf_abi_cxx11_);
    std::__cxx11::string::append(local_2e8._M_local_buf);
    local_278 = (undefined1  [8])local_268;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_278,local_2e8._M_allocated_capacity,
               (char *)(local_2e8._8_8_ + local_2e8._M_allocated_capacity));
    std::__cxx11::string::append(local_278);
    DeleteFiles((string *)local_278);
    if (local_278 != (undefined1  [8])local_268) {
      free((void *)local_278);
    }
    google::SetLogDestination(GLOG_INFO,(char *)local_2e8._M_allocated_capacity);
    google::SetLogFilenameExtension("specialextension");
    google::LogMessage::LogMessage
              ((LogMessage *)local_278,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
               ,0x393);
    poVar10 = google::LogMessage::stream((LogMessage *)local_278);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"message to new extension",0x18);
    google::LogMessage::~LogMessage((LogMessage *)local_278);
    google::FlushLogFiles(GLOG_INFO);
    local_308._0_8_ = (LogMessageData *)0x18;
    local_278 = (undefined1  [8])local_268;
    local_278 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_278,(ulong)local_308);
    local_268[0]._M_allocated_capacity = local_308._0_8_;
    *(undefined8 *)local_278 = 0x206567617373656d;
    *(char *)((long)local_278 + 8) = 't';
    *(char *)((long)local_278 + 9) = 'o';
    *(char *)((long)local_278 + 10) = ' ';
    *(char *)((long)local_278 + 0xb) = 'n';
    *(char *)((long)local_278 + 0xc) = 'e';
    *(char *)((long)local_278 + 0xd) = 'w';
    *(char *)((long)local_278 + 0xe) = ' ';
    *(char *)((long)local_278 + 0xf) = 'e';
    *(char *)((long)local_278 + 0x10) = 'x';
    *(char *)((long)local_278 + 0x11) = 't';
    *(char *)((long)local_278 + 0x12) = 'e';
    *(char *)((long)local_278 + 0x13) = 'n';
    *(char *)((long)local_278 + 0x14) = 's';
    *(char *)((long)local_278 + 0x15) = 'i';
    *(char *)((long)local_278 + 0x16) = 'o';
    *(char *)((long)local_278 + 0x17) = 'n';
    local_270 = (LogMessageData *)local_308._0_8_;
    *(char *)((long)local_278 + local_308._0_8_) = '\0';
    CheckFile((string *)local_2e8._M_allocated_capacity,(string *)local_2e8._8_8_,SUB81(local_278,0)
             );
    if (local_278 != (undefined1  [8])local_268) {
      free((void *)local_278);
    }
    local_308._0_8_ = (string *)0x0;
    local_308._8_8_ = (string *)0x0;
    local_308._16_8_ = (pointer)0x0;
    local_278 = (undefined1  [8])local_268;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_278,local_2e8._M_allocated_capacity,
               (char *)(local_2e8._8_8_ + local_2e8._M_allocated_capacity));
    std::__cxx11::string::append(local_278);
    GetFiles((string *)local_278,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_308);
    if (local_278 != (undefined1  [8])local_268) {
      free((void *)local_278);
    }
    local_278 = (undefined1  [8])((long)(local_308._8_8_ - local_308._0_8_) >> 5);
    local_288[0].str_ = (string *)0x1;
    if ((local_308._8_8_ - local_308._0_8_ == 0x20) ||
       (psVar18 = google::MakeCheckOpString<unsigned_long,unsigned_long>
                            ((unsigned_long *)local_278,(unsigned_long *)local_288,
                             "filenames.size() == 1UL"), psVar18 == (string *)0x0)) {
      pcVar12 = strstr(((_Alloc_hider *)local_308._0_8_)->_M_p,"specialextension");
      if (pcVar12 == (char *)0x0) {
        google::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_278,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                   ,0x39b);
        poVar10 = google::LogMessage::stream((LogMessage *)local_278);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,
                   "Check failed: strstr(filenames[0].c_str(), \"specialextension\") != nullptr ",
                   0x4a);
        goto LAB_0010cc73;
      }
      google::LogToStderr();
      local_278 = (undefined1  [8])local_268;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_278,local_2e8._M_allocated_capacity,
                 (char *)(local_2e8._8_8_ + local_2e8._M_allocated_capacity));
      std::__cxx11::string::append(local_278);
      DeleteFiles((string *)local_278);
      if (local_278 != (undefined1  [8])local_268) {
        free((void *)local_278);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_308);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_allocated_capacity != &local_2d8) {
        free((void *)local_2e8._M_allocated_capacity);
      }
      fwrite("==== Test log wrapper\n",0x16,1,_stderr);
      local_2e8._M_allocated_capacity = local_2e8._M_allocated_capacity & 0xffffffffffffff00;
      pLVar13 = (Logger *)operator_new(0x30);
      pLVar13->_vptr_Logger = (_func_int **)&PTR__MyLogger_00141420;
      pLVar13[1]._vptr_Logger = (_func_int **)(pLVar13 + 3);
      pLVar13[2]._vptr_Logger = (_func_int **)0x0;
      *(undefined1 *)&pLVar13[3]._vptr_Logger = 0;
      pLVar13[5]._vptr_Logger = (_func_int **)&local_2e8;
      pLVar14 = google::base::GetLogger(GLOG_INFO);
      google::base::SetLogger(GLOG_INFO,pLVar13);
      google::LogMessage::LogMessage
                ((LogMessage *)local_278,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0x3bf);
      poVar10 = google::LogMessage::stream((LogMessage *)local_278);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"Send to wrapped logger",0x16);
      google::LogMessage::~LogMessage((LogMessage *)local_278);
      pcVar12 = strstr((char *)pLVar13[1]._vptr_Logger,"Send to wrapped logger");
      if (pcVar12 == (char *)0x0) {
        google::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_278,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                   ,0x3c0);
        poVar10 = google::LogMessage::stream((LogMessage *)local_278);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,
                   "Check failed: strstr(my_logger->data.c_str(), \"Send to wrapped logger\") != nullptr "
                   ,0x53);
        goto LAB_0010cc73;
      }
      google::FlushLogFiles(GLOG_INFO);
      if (local_2e8._M_local_buf[0] == '\x01') goto LAB_0010c8e6;
      google::base::SetLogger(GLOG_INFO,pLVar14);
      if (local_2e8._M_local_buf[0] == '\0') goto LAB_0010c8eb;
      fwrite("==== Test errno preservation\n",0x1d,1,_stderr);
      piVar15 = __errno_location();
      *piVar15 = 2;
      TestLogging(false);
      local_278._0_4_ = *piVar15;
      local_2e8._M_allocated_capacity._0_4_ = 2;
      if ((*piVar15 != 2) &&
         (paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)google::MakeCheckOpString<int,int>
                                 ((int *)local_278,(int *)local_2e8._M_local_buf,
                                  "(*__errno_location ()) == 2"),
         paVar11 !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0)) {
        local_2e8._M_allocated_capacity = (size_type)paVar11;
        google::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_278,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                   ,0x3cd,(CheckOpString *)&local_2e8._M_allocated_capacity);
        google::LogMessage::stream((LogMessage *)local_278);
        goto LAB_0010cc73;
      }
      fwrite("==== Test log truncation\n",0x19,1,_stderr);
      local_2e8._M_allocated_capacity = (size_type)&local_2d8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2e8,fLS::FLAGS_test_tmpdir_buf_abi_cxx11_,
                 DAT_00142aa0 + fLS::FLAGS_test_tmpdir_buf_abi_cxx11_);
      std::__cxx11::string::append(local_2e8._M_local_buf);
      TestOneTruncate((char *)local_2e8._M_allocated_capacity,10,10,10,10,10);
      TestOneTruncate((char *)local_2e8._M_allocated_capacity,0x200000,0x1000,0x300000,0x1000,0x1000
                     );
      TestOneTruncate((char *)local_2e8._M_allocated_capacity,10,0x14,0,0x14,0x14);
      TestOneTruncate((char *)local_2e8._M_allocated_capacity,10,0,0,0,0);
      TestOneTruncate((char *)local_2e8._M_allocated_capacity,10,0x32,0,10,10);
      SVar21 = 0x1e;
      TestOneTruncate((char *)local_2e8._M_allocated_capacity,0x32,100,0,0x1e,0x1e);
      local_308._0_8_ = psVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_308,local_2e8._M_allocated_capacity,
                 local_2e8._8_8_ + local_2e8._M_allocated_capacity);
      std::__cxx11::string::append(local_308);
      unlink((char *)local_308._0_8_);
      iVar3 = symlink((char *)local_2e8._M_allocated_capacity,(char *)local_308._0_8_);
      if (iVar3 == -1) {
        local_288[0].str_ = (string *)google::LogMessage::SendToLog;
        local_288[1].str_ = (string *)0x0;
        google::ErrnoLogMessage::ErrnoLogMessage
                  ((ErrnoLogMessage *)local_278,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                   ,0x415,FATAL,0,SVar21);
        poVar10 = google::LogMessage::stream((LogMessage *)local_278);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,"symlink(path.c_str(), linkname.c_str())",0x27);
        google::ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)local_278);
      }
      SVar21 = 0x1e;
      TestOneTruncate((char *)local_308._0_8_,10,10,0,0x1e,0x1e);
      uVar5 = open((char *)local_2e8._M_allocated_capacity,0x401);
      if (uVar5 == 0xffffffff) {
        local_288[0].str_ = (string *)google::LogMessage::SendToLog;
        local_288[1].str_ = (string *)0x0;
        google::ErrnoLogMessage::ErrnoLogMessage
                  ((ErrnoLogMessage *)local_278,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                   ,0x41d,FATAL,0,SVar21);
        poVar10 = google::LogMessage::stream((LogMessage *)local_278);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,"fd = open(path.c_str(), O_APPEND | O_WRONLY)",0x2c);
        google::ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)local_278);
      }
      snprintf(local_278,0x40,"/proc/self/fd/%d",(ulong)uVar5);
      TestOneTruncate(local_278,10,10,10,10,10);
      if ((string *)local_308._0_8_ != psVar1) {
        free((void *)local_308._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_allocated_capacity != &local_2d8) {
        free((void *)local_2e8._M_allocated_capacity);
      }
      pLVar13 = (Logger *)operator_new(0x18);
      pLVar14 = google::base::GetLogger(GLOG_INFO);
      pLVar13->_vptr_Logger = (_func_int **)&PTR__RecordDeletionLogger_00141478;
      pLVar13[1]._vptr_Logger = (_func_int **)local_278;
      pLVar13[2]._vptr_Logger = (_func_int **)pLVar14;
      local_278 = (undefined1  [8])((ulong)local_278 & 0xffffffffffffff00);
      google::base::SetLogger(GLOG_INFO,pLVar13);
      bVar2 = google::IsGoogleLoggingInitialized();
      if (!bVar2) goto LAB_0010c8f0;
      google::ShutdownGoogleLogging();
      if (local_278[0] == (string)0x0) goto LAB_0010c8f5;
      bVar2 = google::IsGoogleLoggingInitialized();
      if (!bVar2) {
        fwrite("==== Test log periodically\n",0x1b,1,_stderr);
        local_2a8 = 0;
        uStack_2a0 = 0;
        local_2b8 = 0;
        uStack_2b0 = 0;
        local_2c8 = 0;
        uStack_2c0 = 0;
        local_2d8._M_allocated_capacity = 0;
        local_2d8._8_8_ = 0;
        local_2e8._M_allocated_capacity = 0;
        local_2e8._8_8_ = (string *)0x0;
        local_298 = 0;
        uVar22 = 0;
        do {
          lVar16 = std::chrono::_V2::steady_clock::now();
          if (10000000 < lVar16 - _ZZL19TestLogPeriodicallyvE20previousTimeRaw_1135_0) {
            _ZZL19TestLogPeriodicallyvE20previousTimeRaw_1135_0 = lVar16;
            google::LogMessage::LogMessage
                      ((LogMessage *)local_278,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                       ,0x46f,GLOG_INFO);
            poVar10 = google::LogMessage::stream((LogMessage *)local_278);
            uVar17 = std::chrono::_V2::steady_clock::now();
            *(undefined8 *)((long)&local_2e8 + uVar22 * 8 + 8) = uVar17;
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"Timed Message #",0xf);
            uVar22 = uVar22 + 1;
            std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
            google::LogMessage::~LogMessage((LogMessage *)local_278);
          }
        } while (uVar22 < 10);
        lVar16 = 2;
        uVar17 = local_2e8._8_8_;
        do {
          psVar1 = *(string **)((long)&local_2e8 + lVar16 * 8);
          local_288[lVar16].str_ = (string *)((long)psVar1 - uVar17);
          lVar16 = lVar16 + 1;
          uVar17 = psVar1;
        } while (lVar16 != 0xb);
        lVar16 = 0;
        while( true ) {
          uVar19 = *(long *)(local_278 + lVar16) - 10000000;
          uVar22 = -uVar19;
          if (0 < (long)uVar19) {
            uVar22 = uVar19;
          }
          if (500000 < uVar22) break;
          lVar16 = lVar16 + 8;
          if (lVar16 == 0x48) {
            fwrite("PASS\n",5,1,_stdout);
            if (local_50[0] != local_40) {
              free(local_50[0]);
            }
            if (local_70 != local_60) {
              free(local_70);
            }
            return 0;
          }
        }
        goto LAB_0010c8e1;
      }
      goto LAB_0010c8fa;
    }
  }
  local_288[0].str_ = psVar18;
  google::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_278,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
             ,0x39a,local_288);
  google::LogMessage::stream((LogMessage *)local_278);
LAB_0010cc73:
  google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_278);
}

Assistant:

int main(int argc, char** argv) {
  FLAGS_colorlogtostderr = false;
  FLAGS_timestamp_in_logfile_name = true;

  // Make sure stderr is not buffered as stderr seems to be buffered
  // on recent windows.
  setbuf(stderr, nullptr);

  // Test some basics before InitGoogleLogging:
  CaptureTestStderr();
  LogWithLevels(FLAGS_v, FLAGS_stderrthreshold, FLAGS_logtostderr,
                FLAGS_alsologtostderr);
  LogWithLevels(0, 0, false, false);  // simulate "before global c-tors"
  const string early_stderr = GetCapturedTestStderr();

  EXPECT_FALSE(IsGoogleLoggingInitialized());

  // Setting a custom prefix generator (it will use the default format so that
  // the golden outputs can be reused):
  string prefix_attacher_data = "good data";
  InitGoogleLogging(argv[0], &PrefixAttacher,
                    static_cast<void*>(&prefix_attacher_data));

  EXPECT_TRUE(IsGoogleLoggingInitialized());

  RunSpecifiedBenchmarks();

  FLAGS_logtostderr = true;

  InitGoogleTest(&argc, argv);
#ifdef HAVE_LIB_GMOCK
  InitGoogleMock(&argc, argv);
#endif

#ifdef GLOG_USE_GFLAGS
  ParseCommandLineFlags(&argc, &argv, true);
#endif

  // so that death tests run before we use threads
  CHECK_EQ(RUN_ALL_TESTS(), 0);

  CaptureTestStderr();

  // re-emit early_stderr
  LogMessage("dummy", LogMessage::kNoLogPrefix, GLOG_INFO).stream()
      << early_stderr;

  TestLogging(true);
  TestRawLogging();
  TestLoggingLevels();
  TestVLogModule();
  TestLogString();
  TestLogSink();
  TestLogToString();
  TestLogSinkWaitTillSent();
  TestCHECK();
  TestDCHECK();
  TestSTREQ();

  // TODO: The golden test portion of this test is very flakey.
  EXPECT_TRUE(
      MungeAndDiffTestStderr(FLAGS_test_srcdir + "/src/logging_unittest.err"));

  FLAGS_logtostderr = false;

  FLAGS_logtostdout = true;
  FLAGS_stderrthreshold = NUM_SEVERITIES;
  CaptureTestStdout();
  TestRawLogging();
  TestLoggingLevels();
  TestLogString();
  TestLogSink();
  TestLogToString();
  TestLogSinkWaitTillSent();
  TestCHECK();
  TestDCHECK();
  TestSTREQ();
  EXPECT_TRUE(
      MungeAndDiffTestStdout(FLAGS_test_srcdir + "/src/logging_unittest.out"));
  FLAGS_logtostdout = false;

  TestBasename();
  TestBasenameAppendWhenNoTimestamp();
  TestTwoProcessesWrite();
  TestSymlink();
  TestExtension();
  TestWrapper();
  TestErrno();
  TestTruncate();
  TestCustomLoggerDeletionOnShutdown();
  TestLogPeriodically();

  fprintf(stdout, "PASS\n");
  return 0;
}